

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,Indent *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          StringTree *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  size_t result;
  size_t sVar4;
  ulong __n;
  size_t result_2;
  long lVar5;
  char *pcVar6;
  String local_b8;
  ulong local_98 [2];
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  size_t sStack_50;
  char *local_48;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_98[0] = (ulong)(uint)this->size_;
  local_98[1] = *(ulong *)(params + 2);
  local_88 = params_1->size_;
  sStack_80 = params_2->size_;
  local_78 = params_3->size_;
  sStack_70 = params_4->size_;
  local_68 = params_5->ptr;
  local_60 = (params_6->text).content.ptr;
  local_58 = params_7->ptr;
  sStack_50 = params_8->size_;
  local_48 = (params_9->text).content.ptr;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_98 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  __return_storage_ptr__->size_ = sVar4;
  local_68 = (char *)0x0;
  local_58 = (char *)0x0;
  sStack_50 = 0;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_98 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  local_38 = params_3;
  heapString(&local_b8,sVar4);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (*(code *)**(undefined8 **)pAVar1)(pAVar1,pcVar6,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_b8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_b8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_b8.content.disposer;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_68 = (char *)0x1;
  sVar4 = 0;
  local_60 = (char *)0x0;
  local_58 = (char *)0x1;
  sStack_50 = 1;
  local_48 = (char *)0x0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_98 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  local_b8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_b8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_b8.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar1)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_b8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_b8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_b8.content.disposer;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (ulong)(uint)this->size_;
  if (__n != 0) {
    memset(pcVar6,0x20,__n);
    pcVar6 = pcVar6 + __n;
  }
  sVar3 = *(size_t *)(params + 2);
  if (sVar3 != 0) {
    memcpy(pcVar6,*(void **)params,sVar3);
    pcVar6 = pcVar6 + sVar3;
  }
  sVar3 = params_1->size_;
  if (sVar3 != 0) {
    memcpy(pcVar6,params_1->ptr,sVar3);
    pcVar6 = pcVar6 + sVar3;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,params_2,local_38,params_4,(StringTree *)params_5,
             (ArrayPtr<const_char> *)params_6,(StringTree *)params_7,params_8,
             (ArrayPtr<const_char> *)params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}